

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sglrGLContext.cpp
# Opt level: O3

void __thiscall sglr::GLContext::scissor(GLContext *this,int x,int y,int width,int height)

{
  ostringstream *this_00;
  int iVar1;
  undefined4 extraout_var;
  int iVar2;
  int iVar3;
  undefined1 local_1b0 [384];
  
  (this->m_curScissor).m_data[0] = x;
  (this->m_curScissor).m_data[1] = y;
  (this->m_curScissor).m_data[2] = width;
  (this->m_curScissor).m_data[3] = height;
  if ((this->m_logFlags & 1) != 0) {
    local_1b0._0_8_ = this->m_log;
    this_00 = (ostringstream *)(local_1b0 + 8);
    std::__cxx11::ostringstream::ostringstream(this_00);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)this_00,"glScissor(",10);
    std::ostream::operator<<(this_00,x);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)this_00,", ",2);
    std::ostream::operator<<(this_00,y);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)this_00,", ",2);
    std::ostream::operator<<(this_00,width);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)this_00,", ",2);
    std::ostream::operator<<(this_00,height);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)this_00,");",2);
    tcu::MessageBuilder::operator<<
              ((MessageBuilder *)local_1b0,(EndMessageToken *)&tcu::TestLog::EndMessage);
    std::__cxx11::ostringstream::~ostringstream(this_00);
    std::ios_base::~ios_base((ios_base *)(local_1b0 + 0x78));
  }
  iVar3 = 0;
  iVar2 = 0;
  if (this->m_drawFramebufferBinding == 0) {
    iVar3 = (this->m_baseViewport).m_data[0];
    iVar2 = (this->m_baseViewport).m_data[1];
  }
  iVar1 = (*this->m_context->_vptr_RenderContext[3])();
  (**(code **)(CONCAT44(extraout_var,iVar1) + 0x1290))(iVar3 + x,iVar2 + y,width,height);
  return;
}

Assistant:

void GLContext::scissor (int x, int y, int width, int height)
{
	m_curScissor = tcu::IVec4(x, y, width, height);

	// \note For clarity don't add the offset to log
	if ((m_logFlags & GLCONTEXT_LOG_CALLS) != 0)
		m_log << TestLog::Message << "glScissor(" << x << ", " << y << ", " << width << ", " << height << ");" << TestLog::EndMessage;

	tcu::IVec2 offset = getDrawOffset();
	m_context.getFunctions().scissor(offset.x()+x, offset.y()+y, width, height);
}